

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O2

PaHostApiIndex Pa_HostApiTypeIdToHostApiIndex(PaHostApiTypeId type)

{
  ulong uVar1;
  ulong uVar2;
  
  if (initializationCount_ == 0) {
    uVar1 = 0xffffd8f0;
  }
  else {
    uVar1 = 0;
    uVar2 = (ulong)(uint)hostApisCount_;
    if (hostApisCount_ < 1) {
      uVar2 = uVar1;
    }
    while( true ) {
      if (uVar2 == uVar1) {
        return -0x26fb;
      }
      if ((hostApis_[uVar1]->info).type == type) break;
      uVar1 = uVar1 + 1;
    }
  }
  return (PaHostApiIndex)uVar1;
}

Assistant:

PaHostApiIndex Pa_HostApiTypeIdToHostApiIndex( PaHostApiTypeId type )
{
    PaHostApiIndex result;
    int i;
    
    PA_LOGAPI_ENTER_PARAMS( "Pa_HostApiTypeIdToHostApiIndex" );
    PA_LOGAPI(("\tPaHostApiTypeId type: %d\n", type ));

    if( !PA_IS_INITIALISED_ )
    {
        result = paNotInitialized;
    }
    else
    {
        result = paHostApiNotFound;
        
        for( i=0; i < hostApisCount_; ++i )
        {
            if( hostApis_[i]->info.type == type )
            {
                result = i;
                break;
            }         
        }
    }

    PA_LOGAPI_EXIT_PAERROR_OR_T_RESULT( "Pa_HostApiTypeIdToHostApiIndex", "PaHostApiIndex: %d", result );

    return result;
}